

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxFRandom::FxFRandom
          (FxFRandom *this,FRandom *r,FxExpression *mi,FxExpression *ma,FScriptPosition *pos)

{
  FxExpression *pFVar1;
  
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxRandom).super_FxExpression.ScriptPosition,pos);
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)0x0;
  (this->super_FxRandom).super_FxExpression.isresolved = false;
  (this->super_FxRandom).super_FxExpression.NeedResult = true;
  (this->super_FxRandom).super_FxExpression.ExprType = EFX_Random;
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxRandom_007103e8;
  (this->super_FxRandom).EmitTail = false;
  (this->super_FxRandom).min = (FxExpression *)0x0;
  (this->super_FxRandom).max = (FxExpression *)0x0;
  (this->super_FxRandom).rng = r;
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)TypeSInt32;
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxRandom_007104b8;
  if (ma != (FxExpression *)0x0 && mi != (FxExpression *)0x0) {
    pFVar1 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition(&pFVar1->ScriptPosition,&mi->ScriptPosition);
    pFVar1->ValueType = (PType *)0x0;
    pFVar1->isresolved = false;
    pFVar1->NeedResult = true;
    pFVar1->ExprType = EFX_FloatCast;
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0070f618;
    pFVar1[1]._vptr_FxExpression = (_func_int **)mi;
    pFVar1->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).min = pFVar1;
    pFVar1 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition(&pFVar1->ScriptPosition,&ma->ScriptPosition);
    pFVar1->ValueType = (PType *)0x0;
    pFVar1->isresolved = false;
    pFVar1->NeedResult = true;
    pFVar1->ExprType = EFX_FloatCast;
    pFVar1->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0070f618;
    pFVar1[1]._vptr_FxExpression = (_func_int **)ma;
    pFVar1->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).max = pFVar1;
  }
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)TypeFloat64;
  (this->super_FxRandom).super_FxExpression.ExprType = EFX_FRandom;
  return;
}

Assistant:

FxFRandom::FxFRandom(FRandom *r, FxExpression *mi, FxExpression *ma, const FScriptPosition &pos)
: FxRandom(r, nullptr, nullptr, pos, true)
{
	if (mi != nullptr && ma != nullptr)
	{
		min = new FxFloatCast(mi);
		max = new FxFloatCast(ma);
	}
	ValueType = TypeFloat64;
	ExprType = EFX_FRandom;
}